

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O0

void __thiscall CPT::SetRandom(CPT *this)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  reference pdVar4;
  long in_RDI;
  size_t x_1;
  double p;
  size_t x;
  double psum;
  size_t y;
  size_t Y;
  size_t X;
  double in_stack_ffffffffffffffa8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RDI + 8));
  sVar3 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size2((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RDI + 8));
  for (local_20 = 0; local_20 < sVar3; local_20 = local_20 + 1) {
    local_28 = 0.0;
    for (local_30 = 0; local_30 < sVar2; local_30 = local_30 + 1) {
      iVar1 = rand();
      in_stack_ffffffffffffffb0 =
           (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)(double)iVar1;
      local_28 = (double)in_stack_ffffffffffffffb0 + local_28;
      pdVar4 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,0xb02481)
      ;
      *pdVar4 = (double)in_stack_ffffffffffffffb0;
    }
    for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
      in_stack_ffffffffffffffa8 = local_28;
      pdVar4 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(in_stack_ffffffffffffffb0,(size_type)local_28,0xb024d3);
      *pdVar4 = *pdVar4 / in_stack_ffffffffffffffa8;
    }
  }
  return;
}

Assistant:

void CPT::SetRandom()
{
    //cout << "Starting CPT::SanityCheck()"<<endl;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        double psum = 0.0;
        for(size_t x=0; x < X; x++) 
        {
            double p = rand();
            psum += p;
            _m_probTable(x,y) = p;
        }
        //normalize:
        for(size_t x=0; x < X; x++) 
            _m_probTable(x,y) /= psum;
    }

}